

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item.hpp
# Opt level: O2

Item * __thiscall ItemGolds::gold_value(ItemGolds *this,uint16_t value)

{
  undefined6 in_register_00000032;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  std::__cxx11::to_string(&local_38,(int)CONCAT62(in_register_00000032,value));
  std::operator+(&bStack_58,&local_38," golds");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&(this->super_Item)._name,&bStack_58);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_Item)._gold_value = value;
  return &this->super_Item;
}

Assistant:

Item& gold_value(uint16_t value) override
    {
        this->name(std::to_string(value) + " golds");
        return Item::gold_value(value);
    }